

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char_const*,char[19],char_const*,char[25],std::__cxx11::string,char[30],std::__cxx11::string,char[134]>
          (string *__return_storage_ptr__,Diligent *this,char **Args,char (*Args_1) [19],
          char **Args_2,char (*Args_3) [25],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_4,
          char (*Args_5) [30],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_6,
          char (*Args_7) [134])

{
  stringstream local_1c8 [8];
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_local_4;
  char (*Args_local_3) [25];
  char **Args_local_2;
  char (*Args_local_1) [19];
  char **Args_local;
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[19],char_const*,char[25],std::__cxx11::string,char[30],std::__cxx11::string,char[134]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char **)this,(char (*) [19])Args,(char **)Args_1,(char (*) [25])Args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_3,
             (char (*) [30])Args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_5,
             (char (*) [134])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}